

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t size;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t expression;
  size_t i;
  size_t expressionCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_87263bca gcFrame;
  sysbvm_astMakeByteArrayNode_t **byteArrayNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  expressionCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  size = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x28));
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_byteArray_create(context,size);
  for (expression = 0; expression < size; expression = expression + 1) {
    sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x28),expression);
    sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar1,arguments[1]);
    sysbvm_arrayOrByteArray_atPut((sysbvm_tuple_t)gcFrameRecord.roots,expression,sVar1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeByteArrayNode_t **byteArrayNode = (sysbvm_astMakeByteArrayNode_t**)node;

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t element;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*byteArrayNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*byteArrayNode)->elements);
    gcFrame.result = sysbvm_byteArray_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        sysbvm_tuple_t expression = sysbvm_array_at((*byteArrayNode)->elements, i);
        gcFrame.element = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, expression, *environment);
        sysbvm_arrayOrByteArray_atPut(gcFrame.result, i, gcFrame.element);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}